

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushClosure::encode(PushClosure *this,uint8_t *buffer)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  PushClosure *this_00;
  
  uVar1 = this->numCopied;
  iVar2 = this->numArgs;
  uVar4 = uVar1 + 7;
  if (-1 < (int)uVar1) {
    uVar4 = uVar1;
  }
  iVar3 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  this_00 = this;
  InstructionNode::encodeExtA
            (&this->super_InstructionNode,buffer,
             (long)(int)((iVar3 >> 3) + (uVar4 & 0xfffffff8) * 2));
  iVar2 = (int)(this->blockEnd->super_InstructionNode).lastPosition;
  iVar3 = (int)(this->super_InstructionNode).lastPosition + (int)(this->super_InstructionNode).size;
  iVar5 = iVar2 - iVar3;
  iVar2 = (iVar2 - iVar3) + 0xff;
  if (-1 < iVar5) {
    iVar2 = iVar5;
  }
  InstructionNode::encodeExtB(&this_00->super_InstructionNode,buffer,(long)(iVar2 >> 8));
  *buffer = 0xfa;
  buffer[1] = (byte)(this->numCopied << 7) |
              (byte)this->numArgs & 7 | (byte)(this->numExtensions << 6);
  buffer[2] = (char)(int)(this->blockEnd->super_InstructionNode).lastPosition -
              ((char)(int)(this->super_InstructionNode).lastPosition +
              (char)(int)(this->super_InstructionNode).size);
  return buffer + 3;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
    	{
            buffer = encodeExtA(buffer, extendAValue());
            buffer = encodeExtB(buffer, extendBValue());

    		*buffer++ = BytecodeSet::PushClosure;
    		*buffer++ =
                ((numExtensions & BytecodeSet::PushClosure_NumExtensionsMask) << BytecodeSet::PushClosure_NumExtensionsShift) |
                ((numArgs & BytecodeSet::PushClosure_NumArgsMask) << BytecodeSet::PushClosure_NumArgsShift) |
                ((numCopied & BytecodeSet::PushClosure_NumCopiedMask) << BytecodeSet::PushClosure_NumCopiedShift);
            *buffer++ = blockSize() & 0xFF;
    		return buffer;
    	}